

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordComponentInvarianceCase::init
          (TessCoordComponentInvarianceCase *this,EVP_PKEY_CTX *ctx)

{
  _Base_ptr p_Var1;
  deInt32 *pdVar2;
  size_type *psVar3;
  Context *pCVar4;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar5;
  RenderTarget *pRVar6;
  long *plVar7;
  undefined8 *puVar8;
  SharedPtrStateBase *pSVar9;
  ContextInfo *extraout_RAX;
  ContextInfo *pCVar10;
  TestError *this_00;
  ulong *puVar11;
  Context *code;
  pointer pcVar12;
  undefined8 uVar13;
  undefined1 in_R9B;
  deInt32 *pdVar14;
  long lVar15;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string local_2e8;
  ShaderProgram *local_2c8;
  string local_2c0;
  size_type *local_2a0;
  value_type local_298;
  size_type *local_278;
  value_type local_270;
  string local_250;
  size_type *local_230;
  value_type local_228;
  undefined1 local_208 [32];
  ContextInfo *local_1e8;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d0;
  Context *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  ContextInfo *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  pointer local_180;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  string local_120;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  deUint32 local_58;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar6->m_width,
             (RenderTarget *)(ulong)(uint)pRVar6->m_height,0x10);
  local_160._M_allocated_capacity = (size_type)local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_170 + 0x10),
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  local_180 = (pointer)local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nin highp float in_tc_attr[];\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
             ,"");
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_208,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
             this->m_spacing,this->m_winding,(uint)this->m_usePointMode,(bool)in_R9B);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x1c3bf3f);
  pCVar10 = (ContextInfo *)(plVar7 + 2);
  if ((ContextInfo *)*plVar7 == pCVar10) {
    local_1e0._8_8_ = pCVar10->_vptr_ContextInfo;
    aStack_1d0._M_allocated_capacity = plVar7[3];
    local_1e8 = (ContextInfo *)(local_1e0 + 8);
  }
  else {
    local_1e0._8_8_ = pCVar10->_vptr_ContextInfo;
    local_1e8 = (ContextInfo *)*plVar7;
  }
  local_1e0._0_8_ = plVar7[1];
  *plVar7 = (long)pCVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  psVar3 = &local_228._M_string_length;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((size_type *)*plVar7 == puVar11) {
    local_228._M_string_length = *puVar11;
    local_228.field_2._M_allocated_capacity._0_4_ = (undefined4)plVar7[3];
    local_228.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_230 = psVar3;
  }
  else {
    local_228._M_string_length = *puVar11;
    local_230 = (size_type *)*plVar7;
  }
  local_228._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&local_2c0,this,"gl_TessCoord.x","out_te_output.x");
  pcVar12 = (pointer)0xf;
  if (local_230 != psVar3) {
    pcVar12 = (pointer)local_228._M_string_length;
  }
  if (pcVar12 < local_228._M_dataplus._M_p + local_2c0._M_string_length) {
    uVar13 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      uVar13 = local_2c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_228._M_dataplus._M_p + local_2c0._M_string_length) goto LAB_0141d036;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_230);
  }
  else {
LAB_0141d036:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_2c0._M_dataplus._M_p);
  }
  local_2a0 = &local_298._M_string_length;
  puVar11 = puVar8 + 2;
  if ((size_type *)*puVar8 == puVar11) {
    local_298._M_string_length = *puVar11;
    local_298.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar8 + 3);
    local_298.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
  }
  else {
    local_298._M_string_length = *puVar11;
    local_2a0 = (size_type *)*puVar8;
  }
  local_298._M_dataplus._M_p = (pointer)puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&local_250,this,"gl_TessCoord.y","out_te_output.y");
  pcVar12 = (pointer)0xf;
  if (local_2a0 != &local_298._M_string_length) {
    pcVar12 = (pointer)local_298._M_string_length;
  }
  if (pcVar12 < local_298._M_dataplus._M_p + local_250._M_string_length) {
    uVar13 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar13 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_298._M_dataplus._M_p + local_250._M_string_length) goto LAB_0141d10f;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_0141d10f:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_250._M_dataplus._M_p);
  }
  local_278 = &local_270._M_string_length;
  puVar11 = puVar8 + 2;
  if ((size_type *)*puVar8 == puVar11) {
    local_270._M_string_length = *puVar11;
    local_270.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar8 + 3);
    local_270.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
  }
  else {
    local_270._M_string_length = *puVar11;
    local_278 = (size_type *)*puVar8;
  }
  local_270._M_dataplus._M_p = (pointer)puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (&local_2e8,this,"gl_TessCoord.z","out_te_output.z");
  }
  else {
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"\tout_te_output.z = 0.0f;\n","");
  }
  pcVar12 = (pointer)0xf;
  if (local_278 != &local_270._M_string_length) {
    pcVar12 = (pointer)local_270._M_string_length;
  }
  if (pcVar12 < local_270._M_dataplus._M_p + local_2e8._M_string_length) {
    uVar13 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      uVar13 = local_2e8.field_2._M_allocated_capacity;
    }
    if (local_270._M_dataplus._M_p + local_2e8._M_string_length <= (ulong)uVar13) {
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_2e8,0,(char *)0x0,(ulong)local_278);
      goto LAB_0141d21f;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_278,(ulong)local_2e8._M_dataplus._M_p);
LAB_0141d21f:
  local_100._0_8_ = local_100 + 0x10;
  p_Var1 = (_Base_ptr)(plVar7 + 2);
  if ((_Base_ptr)*plVar7 == p_Var1) {
    local_100._16_8_ = ((_Alloc_hider *)&p_Var1->_M_color)->_M_p;
    pbStack_e8 = (pointer)plVar7[3];
  }
  else {
    local_100._16_8_ = ((_Alloc_hider *)&p_Var1->_M_color)->_M_p;
    local_100._0_8_ = (_Base_ptr)*plVar7;
  }
  local_100._8_8_ = plVar7[1];
  *plVar7 = (long)p_Var1;
  plVar7[1] = 0;
  *(undefined1 *)&((_Alloc_hider *)&p_Var1->_M_color)->_M_p = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_100);
  local_1c0 = (Context *)local_1b0;
  code = (Context *)(plVar7 + 2);
  if ((Context *)*plVar7 == code) {
    local_1b0._0_8_ = code->m_testCtx;
    local_1b0._8_8_ = plVar7[3];
  }
  else {
    local_1b0._0_8_ = code->m_testCtx;
    local_1c0 = (Context *)*plVar7;
  }
  local_1b8 = plVar7[1];
  *plVar7 = (long)code;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((_Base_ptr)local_100._0_8_ != (_Base_ptr)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != &local_270._M_string_length) {
    operator_delete(local_278,(ulong)(local_270._M_string_length + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0 != &local_298._M_string_length) {
    operator_delete(local_2a0,(ulong)(local_298._M_string_length + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != psVar3) {
    operator_delete(local_230,(ulong)(local_228._M_string_length + 1));
  }
  if (local_1e8 != (ContextInfo *)(local_1e0 + 8)) {
    operator_delete(local_1e8,local_1e0._8_8_ + 1);
  }
  if ((Context *)local_208._0_8_ != (Context *)(local_208 + 0x10)) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
  }
  local_208._0_8_ = (Context *)(local_208 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  local_2c8 = (ShaderProgram *)operator_new(0xd0);
  pCVar4 = (this->super_TestCase).m_context;
  renderCtx = pCVar4->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2c0,(_anonymous_namespace_ *)pCVar4->m_renderCtx,
             (Context *)local_160._M_allocated_capacity,(char *)code);
  local_278 = (size_type *)((ulong)local_278 & 0xffffffff00000000);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_2c0._M_dataplus._M_p,
             local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_278 & 0xffffffff) * 0x18),&local_270);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_180,(char *)code);
  local_2a0 = (size_type *)CONCAT44(local_2a0._4_4_,3);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_250._M_dataplus._M_p,
             local_250._M_dataplus._M_p + local_250._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_2a0 & 0xffffffff) * 0x18),&local_298);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2e8,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_1c0,(char *)code);
  local_230 = (size_type *)CONCAT44(local_230._4_4_,4);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_2e8._M_dataplus._M_p,
             local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_230 & 0xffffffff) * 0x18),&local_228);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_208._0_8_,(char *)code);
  local_1e8 = (ContextInfo *)CONCAT44(local_1e8._4_4_,1);
  local_1e0._0_8_ = &aStack_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,local_120._M_dataplus._M_p,
             local_120._M_dataplus._M_p + local_120._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_1e8 & 0xffffffff) * 0x18),(value_type *)local_1e0);
  local_1a0 = (ContextInfo *)local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"out_te_output","");
  local_140._0_8_ = (ContextInfo *)(local_140 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,local_1a0,
             (undefined1 *)((long)&local_1a0->_vptr_ContextInfo + local_198));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50,(value_type *)local_140);
  local_58 = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(local_2c8,renderCtx,(ProgramSources *)local_100);
  pSVar9 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar2 = &pSVar9->strongRefCount;
  pSVar9->strongRefCount = 0;
  pSVar9->weakRefCount = 0;
  pSVar9->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0212cb98;
  pSVar9[1]._vptr_SharedPtrStateBase = (_func_int **)local_2c8;
  pSVar9->strongRefCount = 1;
  pSVar9->weakRefCount = 1;
  pSVar5 = (this->m_program).m_state;
  if (pSVar5 != pSVar9) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar14 = &pSVar5->strongRefCount;
      *pdVar14 = *pdVar14 + -1;
      UNLOCK();
      if (*pdVar14 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar14 = &((this->m_program).m_state)->weakRefCount;
      *pdVar14 = *pdVar14 + -1;
      UNLOCK();
      if (*pdVar14 == 0) {
        pSVar5 = (this->m_program).m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = local_2c8;
    (this->m_program).m_state = pSVar9;
    LOCK();
    pSVar9->strongRefCount = pSVar9->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar14 = &((this->m_program).m_state)->weakRefCount;
    *pdVar14 = *pdVar14 + 1;
    UNLOCK();
  }
  pdVar14 = &pSVar9->weakRefCount;
  LOCK();
  *pdVar2 = *pdVar2 + -1;
  UNLOCK();
  if (*pdVar2 == 0) {
    (*pSVar9->_vptr_SharedPtrStateBase[2])(pSVar9);
  }
  LOCK();
  *pdVar14 = *pdVar14 + -1;
  UNLOCK();
  if (*pdVar14 == 0) {
    (*pSVar9->_vptr_SharedPtrStateBase[1])(pSVar9);
  }
  if ((ContextInfo *)local_140._0_8_ != (ContextInfo *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if (local_1a0 != (ContextInfo *)local_190) {
    operator_delete(local_1a0,local_190._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &aStack_1d0) {
    operator_delete((void *)local_1e0._0_8_,aStack_1d0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT44(local_228.field_2._M_allocated_capacity._4_4_,
                             local_228.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT44(local_298.field_2._M_allocated_capacity._4_4_,
                             local_298.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT44(local_270.field_2._M_allocated_capacity._4_4_,
                             local_270.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if ((Context *)local_208._0_8_ != (Context *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if (local_1c0 != (Context *)local_1b0) {
      operator_delete(local_1c0,(ulong)((long)(Platform **)local_1b0._0_8_ + 1));
    }
    if (local_180 != (pointer)local_170) {
      operator_delete(local_180,(ulong)(local_170._0_8_ + 1));
    }
    pCVar10 = (ContextInfo *)local_150;
    if ((ContextInfo *)local_160._M_allocated_capacity != pCVar10) {
      operator_delete((void *)local_160._M_allocated_capacity,
                      (ulong)((long)(Platform **)local_150._0_8_ + 1));
      pCVar10 = extraout_RAX;
    }
    return (int)pCVar10;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x13bd);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessCoordComponentInvarianceCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 1) out;\n"
												 "\n"
												 "in highp float in_tc_attr[];\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, m_winding, m_usePointMode) +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "out highp vec3 out_te_output;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tessEvalOutputComponentStatements("gl_TessCoord.x", "out_te_output.x")
												 + tessEvalOutputComponentStatements("gl_TessCoord.y", "out_te_output.y")

												 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
													tessEvalOutputComponentStatements("gl_TessCoord.z", "out_te_output.z") :
													"	out_te_output.z = 0.0f;\n") +
												 "	gl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_output")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}